

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::ScopeObjectChain::TryGetDebuggerScopePropertyInfo
          (ScopeObjectChain *this,PropertyId propertyId,RegSlot location,int offset,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  int iVar1;
  DebuggerScope *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  int index;
  undefined1 local_60 [8];
  DebuggerScopeProperty debuggerScopeProperty;
  
  if ((this->pScopeChain).ptr ==
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1831,"(pScopeChain)","pScopeChain");
    if (!bVar3) goto LAB_00777c0d;
    *puVar6 = 0;
  }
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1832,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar3) goto LAB_00777c0d;
    *puVar6 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1833,"(isConst)","isConst");
    if (!bVar3) {
LAB_00777c0d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  index = 0;
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  this_01 = (this->pScopeChain).ptr;
  iVar1 = (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
          count;
  bVar3 = 0 < iVar1;
  debuggerScopeProperty._8_8_ = isConst;
  if (0 < iVar1) {
    do {
      pTVar7 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index);
      this_00 = pTVar7->ptr;
      if ((1 < this_00->scopeType - DiagParamScope) &&
         (bVar4 = DebuggerScope::TryGetProperty
                            (this_00,propertyId,location,(DebuggerScopeProperty *)local_60), bVar4))
      {
        bVar4 = DebuggerScope::IsOffsetInScope(this_00,offset);
        if (bVar4) {
          *isPropertyInDebuggerScope = true;
          if (isInDeadZone != (bool *)0x0) {
            bVar5 = DebuggerScopeProperty::IsInDeadZone((DebuggerScopeProperty *)local_60,offset);
            *isInDeadZone = bVar5;
          }
          *(byte *)debuggerScopeProperty._8_8_ = (byte)debuggerScopeProperty.location & 1;
          if (bVar4) {
            return bVar3;
          }
        }
        else {
          *isPropertyInDebuggerScope = this_00->scopeType != DiagBlockScopeInObject;
        }
      }
      index = index + 1;
      this_01 = (this->pScopeChain).ptr;
      iVar1 = (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
              count;
      bVar3 = index < iVar1;
    } while (index < iVar1);
  }
  return bVar3;
}

Assistant:

bool ScopeObjectChain::TryGetDebuggerScopePropertyInfo(PropertyId propertyId, RegSlot location, int offset, bool* isPropertyInDebuggerScope, bool *isConst, bool* isInDeadZone)
    {
        Assert(pScopeChain);
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);

        *isPropertyInDebuggerScope = false;
        *isConst = false;

        // Search through each block scope until we find the current scope.  If the register was found
        // in any of the scopes going down until we reach the scope of the debug break, then it's in scope.
        // if found but not in the scope, the out param will be updated (since it is actually a let or const), so that caller can make a call accordingly.
        for (int i = 0; i < pScopeChain->Count(); i++)
        {
            Js::DebuggerScope *debuggerScope = pScopeChain->Item(i);
            DebuggerScopeProperty debuggerScopeProperty;
            if (!debuggerScope->IsParamScope() && debuggerScope->TryGetProperty(propertyId, location, &debuggerScopeProperty))
            {
                bool isOffsetInScope = debuggerScope->IsOffsetInScope(offset);

                // For the Object scope, all the properties will have the same location (-1) so they can match. Use further check below to determine the propertyInDebuggerScope
                *isPropertyInDebuggerScope = isOffsetInScope || !debuggerScope->IsBlockObjectScope();

                if (isOffsetInScope)
                {
                    if (isInDeadZone != nullptr)
                    {
                        *isInDeadZone = debuggerScopeProperty.IsInDeadZone(offset);
                    }

                    *isConst = debuggerScopeProperty.IsConst();
                    return true;
                }
            }
        }

        return false;
    }